

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O3

lzma_ret lzma_stream_encoder_init
                   (lzma_next_coder_conflict2 *next,lzma_allocator *allocator,lzma_filter *filters,
                   lzma_check check)

{
  lzma_ret lVar1;
  lzma_coder_conflict2 *plVar2;
  lzma_index *plVar3;
  lzma_stream_flags stream_flags;
  lzma_stream_flags local_68;
  
  local_68.reserved_enum2 = LZMA_RESERVED_ENUM;
  local_68.reserved_enum3 = LZMA_RESERVED_ENUM;
  local_68.reserved_enum4 = LZMA_RESERVED_ENUM;
  local_68.reserved_bool1 = '\0';
  local_68.reserved_bool2 = '\0';
  local_68.reserved_bool3 = '\0';
  local_68.reserved_bool4 = '\0';
  local_68.reserved_bool5 = '\0';
  local_68.reserved_bool6 = '\0';
  local_68.reserved_bool7 = '\0';
  local_68.reserved_bool8 = '\0';
  local_68.reserved_int1 = 0;
  local_68.version = 0;
  local_68._4_4_ = 0;
  local_68.backward_size = 0;
  local_68.reserved_int2 = 0;
  local_68._52_4_ = 0;
  local_68.reserved_enum1 = LZMA_RESERVED_ENUM;
  local_68.check = check;
  if ((code *)next->init != lzma_stream_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_stream_encoder_init;
  if (filters == (lzma_filter *)0x0) {
    return LZMA_PROG_ERROR;
  }
  plVar2 = next->coder;
  if (plVar2 == (lzma_coder_conflict2 *)0x0) {
    plVar2 = (lzma_coder_conflict2 *)lzma_alloc(0x5c0,allocator);
    next->coder = plVar2;
    if (plVar2 == (lzma_coder_conflict2 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->code = stream_encode;
    next->end = stream_encoder_end;
    next->update = stream_encoder_update;
    plVar2->filters[0].id = 0xffffffffffffffff;
    (plVar2->block_encoder).coder = (lzma_coder_conflict2 *)0x0;
    (plVar2->block_encoder).id = 0xffffffffffffffff;
    (plVar2->block_encoder).init = 0;
    (plVar2->block_encoder).code = (lzma_code_function_conflict2)0x0;
    (plVar2->block_encoder).end = (lzma_end_function_conflict2)0x0;
    (plVar2->block_encoder).get_check = (_func_lzma_check_lzma_coder_ptr_conflict2 *)0x0;
    (plVar2->block_encoder).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict2 *)0x0;
    (plVar2->block_encoder).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict2
          *)0x0;
    (plVar2->index_encoder).coder = (lzma_coder_conflict2 *)0x0;
    (plVar2->index_encoder).id = 0xffffffffffffffff;
    (plVar2->index_encoder).init = 0;
    (plVar2->index_encoder).code = (lzma_code_function_conflict2)0x0;
    (plVar2->index_encoder).end = (lzma_end_function_conflict2)0x0;
    (plVar2->index_encoder).get_check = (_func_lzma_check_lzma_coder_ptr_conflict2 *)0x0;
    (plVar2->index_encoder).memconfig =
         (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict2 *)0x0;
    (plVar2->index_encoder).update =
         (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict2
          *)0x0;
    plVar2->index = (lzma_index *)0x0;
    plVar3 = (lzma_index *)0x0;
  }
  else {
    plVar3 = plVar2->index;
  }
  plVar2->sequence = SEQ_HEADER;
  (plVar2->block_options).version = 0;
  (plVar2->block_options).check = check;
  lzma_index_end(plVar3,allocator);
  plVar3 = lzma_index_init(allocator);
  plVar2 = next->coder;
  plVar2->index = plVar3;
  if (plVar3 == (lzma_index *)0x0) {
    return LZMA_MEM_ERROR;
  }
  lVar1 = lzma_stream_header_encode(&local_68,plVar2->buffer);
  if (lVar1 == LZMA_OK) {
    plVar2 = next->coder;
    plVar2->buffer_pos = 0;
    plVar2->buffer_size = 0xc;
    lVar1 = stream_encoder_update(plVar2,allocator,filters,(lzma_filter *)0x0);
    return lVar1;
  }
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_stream_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		const lzma_filter *filters, lzma_check check)
{
	lzma_stream_flags stream_flags = { 0, 0, check };

	lzma_next_coder_init(&lzma_stream_encoder_init, next, allocator);

	if (filters == NULL)
		return LZMA_PROG_ERROR;

	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &stream_encode;
		next->end = &stream_encoder_end;
		next->update = &stream_encoder_update;

		next->coder->filters[0].id = LZMA_VLI_UNKNOWN;
		next->coder->block_encoder = LZMA_NEXT_CODER_INIT;
		next->coder->index_encoder = LZMA_NEXT_CODER_INIT;
		next->coder->index = NULL;
	}

	// Basic initializations
	next->coder->sequence = SEQ_STREAM_HEADER;
	next->coder->block_options.version = 0;
	next->coder->block_options.check = check;

	// Initialize the Index
	lzma_index_end(next->coder->index, allocator);
	next->coder->index = lzma_index_init(allocator);
	if (next->coder->index == NULL)
		return LZMA_MEM_ERROR;

	// Encode the Stream Header
	return_if_error(lzma_stream_header_encode(
			&stream_flags, next->coder->buffer));

	next->coder->buffer_pos = 0;
	next->coder->buffer_size = LZMA_STREAM_HEADER_SIZE;

	// Initialize the Block encoder. This way we detect unsupported
	// filter chains when initializing the Stream encoder instead of
	// giving an error after Stream Header has already written out.
	return stream_encoder_update(
			next->coder, allocator, filters, NULL);
}